

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O1

FT_Error pfr_extra_items_parse
                   (FT_Byte **pp,FT_Byte *limit,PFR_ExtraItem item_list,FT_Pointer item_data)

{
  byte *pbVar1;
  uint uVar2;
  PFR_ExtraItem_ParseFunc p_Var3;
  PFR_ExtraItem_ParseFunc *pp_Var4;
  FT_Error FVar5;
  byte *pbVar6;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  uint uVar10;
  
  pbVar8 = *pp;
  pbVar9 = pbVar8 + 1;
  if (limit < pbVar9) {
LAB_0014a615:
    FVar5 = 8;
    pbVar9 = pbVar8;
  }
  else {
    uVar10 = (uint)*pbVar8;
    if (*pbVar8 == 0) {
      FVar5 = 0;
    }
    else {
      FVar5 = 0;
      pbVar6 = pbVar9;
      do {
        pbVar1 = pbVar6 + 2;
        pbVar8 = pbVar6;
        if ((limit < pbVar1) || (pbVar9 = pbVar1 + *pbVar6, pbVar8 = pbVar1, limit < pbVar9))
        goto LAB_0014a615;
        if (item_list != (PFR_ExtraItem)0x0) {
          p_Var3 = item_list->parser;
          iVar7 = 0;
          if (p_Var3 != (PFR_ExtraItem_ParseFunc)0x0) {
            uVar2 = item_list->type;
            pp_Var4 = &item_list[1].parser;
            while (uVar2 != pbVar6[1]) {
              p_Var3 = *pp_Var4;
              iVar7 = 0;
              if (p_Var3 == (PFR_ExtraItem_ParseFunc)0x0) goto LAB_0014a6b9;
              uVar2 = ((PFR_ExtraItemRec_ *)(pp_Var4 + -1))->type;
              pp_Var4 = pp_Var4 + 2;
            }
            FVar5 = (*p_Var3)(pbVar1,pbVar9,item_data);
            iVar7 = FVar5;
            if (FVar5 != 0) {
              iVar7 = 0xf;
            }
          }
LAB_0014a6b9:
          if (iVar7 != 0) {
            pbVar9 = pbVar1;
            if (iVar7 != 0xf) {
              return FVar5;
            }
            break;
          }
        }
        uVar10 = uVar10 - 1;
        pbVar6 = pbVar9;
      } while (uVar10 != 0);
    }
  }
  *pp = pbVar9;
  return FVar5;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_extra_items_parse( FT_Byte*       *pp,
                         FT_Byte*        limit,
                         PFR_ExtraItem   item_list,
                         FT_Pointer      item_data )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Byte*  p     = *pp;
    FT_UInt   num_items, item_type, item_size;


    PFR_CHECK( 1 );
    num_items = PFR_NEXT_BYTE( p );

    for ( ; num_items > 0; num_items-- )
    {
      PFR_CHECK( 2 );
      item_size = PFR_NEXT_BYTE( p );
      item_type = PFR_NEXT_BYTE( p );

      PFR_CHECK( item_size );

      if ( item_list )
      {
        PFR_ExtraItem  extra = item_list;


        for ( extra = item_list; extra->parser != NULL; extra++ )
        {
          if ( extra->type == item_type )
          {
            error = extra->parser( p, p + item_size, item_data );
            if ( error )
              goto Exit;

            break;
          }
        }
      }

      p += item_size;
    }

  Exit:
    *pp = p;
    return error;

  Too_Short:
    FT_ERROR(( "pfr_extra_items_parse: invalid extra items table\n" ));
    error = FT_THROW( Invalid_Table );
    goto Exit;
  }